

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImproveCacheLocality.cpp
# Opt level: O2

void __thiscall
Assimp::ImproveCacheLocalityProcess::Execute(ImproveCacheLocalityProcess *this,aiScene *pScene)

{
  bool bVar1;
  Logger *pLVar2;
  uint uVar3;
  uint a;
  ulong uVar4;
  ai_real aVar5;
  float local_1c4;
  char *local_1c0 [4];
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  
  uVar3 = pScene->mNumMeshes;
  pLVar2 = DefaultLogger::get();
  if (uVar3 != 0) {
    Logger::debug(pLVar2,"ImproveCacheLocalityProcess begin");
    uVar3 = 0;
    local_1c4 = 0.0;
    for (uVar4 = 0; uVar4 < pScene->mNumMeshes; uVar4 = uVar4 + 1) {
      aVar5 = ProcessMesh(this,pScene->mMeshes[uVar4],(uint)uVar4);
      if ((aVar5 != 0.0) || (NAN(aVar5))) {
        uVar3 = uVar3 + pScene->mMeshes[uVar4]->mNumFaces;
        local_1c4 = local_1c4 + aVar5;
      }
    }
    bVar1 = DefaultLogger::isNullLogger();
    if (!bVar1) {
      if (uVar3 != 0) {
        pLVar2 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[20]>(&local_1a0,(char (*) [20])"Cache relevant are ");
        std::ostream::_M_insert<unsigned_long>((ulong)&local_1a0);
        std::operator<<((ostream *)&local_1a0," meshes (");
        std::ostream::_M_insert<unsigned_long>((ulong)&local_1a0);
        std::operator<<((ostream *)&local_1a0," faces). Average output ACMR is ");
        std::ostream::operator<<(&local_1a0,local_1c4 / (float)uVar3);
        std::__cxx11::stringbuf::str();
        Logger::info(pLVar2,local_1c0[0]);
        std::__cxx11::string::~string((string *)local_1c0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
      }
      pLVar2 = DefaultLogger::get();
      Logger::debug(pLVar2,"ImproveCacheLocalityProcess finished. ");
    }
    return;
  }
  Logger::debug(pLVar2,"ImproveCacheLocalityProcess skipped; there are no meshes");
  return;
}

Assistant:

void ImproveCacheLocalityProcess::Execute( aiScene* pScene) {
    if (!pScene->mNumMeshes) {
        ASSIMP_LOG_DEBUG("ImproveCacheLocalityProcess skipped; there are no meshes");
        return;
    }

    ASSIMP_LOG_DEBUG("ImproveCacheLocalityProcess begin");

    float out = 0.f;
    unsigned int numf = 0, numm = 0;
    for( unsigned int a = 0; a < pScene->mNumMeshes; ++a ){
        const float res = ProcessMesh( pScene->mMeshes[a],a);
        if (res) {
            numf += pScene->mMeshes[a]->mNumFaces;
            out  += res;
            ++numm;
        }
    }
    if (!DefaultLogger::isNullLogger()) {
        if (numf > 0) {
            ASSIMP_LOG_INFO_F("Cache relevant are ", numm, " meshes (", numf, " faces). Average output ACMR is ", out / numf);
        }
        ASSIMP_LOG_DEBUG("ImproveCacheLocalityProcess finished. ");
    }
}